

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

natwm_error config_array_to_box_sizes(config_array *array,box_sizes *result)

{
  config_value *pcVar1;
  config_value *value;
  size_t i;
  box_sizes sizes;
  box_sizes *result_local;
  config_array *array_local;
  
  if ((array == (config_array *)0x0) || (array->length != 4)) {
    array_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    sizes = (box_sizes)result;
    memset(&i,0,8);
    for (value = (config_value *)0x0; value < (config_value *)0x4;
        value = (config_value *)((long)&value->type + 1)) {
      pcVar1 = array->values[(long)value];
      if ((pcVar1 == (config_value *)0x0) || (pcVar1->type != NUMBER)) {
        return INVALID_INPUT_ERROR;
      }
      if (0xffff < (pcVar1->data).number) {
        __assert_fail("value->data.number <= UINT16_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/common/util.c"
                      ,0x23,
                      "enum natwm_error config_array_to_box_sizes(const struct config_array *, struct box_sizes *)"
                     );
      }
    }
    *(ulong *)sizes =
         CONCAT26((short)(array->values[3]->data).number,
                  CONCAT24((short)(array->values[2]->data).number,
                           CONCAT22((short)(array->values[1]->data).number,
                                    (short)((*array->values)->data).number)));
    array_local._4_4_ = NO_ERROR;
  }
  return array_local._4_4_;
}

Assistant:

enum natwm_error config_array_to_box_sizes(const struct config_array *array,
                                           struct box_sizes *result)
{
        if (array == NULL || array->length != 4) {
                return INVALID_INPUT_ERROR;
        }

        struct box_sizes sizes = {
                .top = 0,
                .right = 0,
                .bottom = 0,
                .left = 0,
        };

        for (size_t i = 0; i < 4; ++i) {
                struct config_value *value = array->values[i];

                if (value == NULL || value->type != NUMBER) {
                        return INVALID_INPUT_ERROR;
                }

                assert(value->data.number <= UINT16_MAX);
        }

        sizes.top = (uint16_t)array->values[0]->data.number;
        sizes.right = (uint16_t)array->values[1]->data.number;
        sizes.bottom = (uint16_t)array->values[2]->data.number;
        sizes.left = (uint16_t)array->values[3]->data.number;

        *result = sizes;

        return NO_ERROR;
}